

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O0

int main(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool local_15;
  bool local_13;
  int result;
  
  iVar2 = test_abi_C();
  iVar3 = test_int_C();
  iVar4 = test_include_C();
  local_13 = iVar4 != 0 && (iVar3 != 0 && iVar2 != 0);
  iVar2 = test_abi_CXX();
  local_15 = false;
  if (iVar2 != 0) {
    local_15 = local_13;
  }
  iVar2 = test_int_CXX();
  local_15 = iVar2 != 0 && local_15;
  iVar2 = test_include_CXX();
  bVar1 = false;
  if (iVar2 != 0) {
    bVar1 = local_15;
  }
  return (uint)!bVar1;
}

Assistant:

int main(void)
{
  int result = 1;
#ifdef KWIML_LANGUAGE_C
  result = test_abi_C() && result;
  result = test_int_C() && result;
  result = test_include_C() && result;
#endif
#ifdef KWIML_LANGUAGE_CXX
  result = test_abi_CXX() && result;
  result = test_int_CXX() && result;
  result = test_include_CXX() && result;
#endif
  return result? 0 : 1;
}